

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

void parsePath(xmllintState *lint,xmlChar *path)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  xmlChar *pxVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if ((path != (xmlChar *)0x0) && (bVar3 = *path, bVar3 != 0)) {
    uVar6 = (ulong)(uint)lint->nbpaths;
    do {
      if (0x3f < (int)uVar6) {
        fwrite("MAX_PATHS reached: too many paths\n",0x22,1,(FILE *)lint->errStream);
        lint->progresult = XMLLINT_ERR_UNCLASS;
        return;
      }
      while ((bVar3 == 0x20 || (bVar3 == 0x3a))) {
        pbVar1 = path + 1;
        path = path + 1;
        bVar3 = *pbVar1;
      }
      lVar7 = 0;
      while ((0x3a < bVar3 || ((0x400000100000001U >> ((ulong)bVar3 & 0x3f) & 1) == 0))) {
        bVar3 = path[lVar7 + 1];
        lVar7 = lVar7 + 1;
      }
      if (lVar7 != 0) {
        path = path + lVar7;
        pxVar4 = (xmlChar *)xmlStrndup();
        iVar2 = lint->nbpaths;
        uVar6 = (ulong)iVar2;
        lint->paths[uVar6] = pxVar4;
        if (pxVar4 != (xmlChar *)0x0) {
          uVar5 = iVar2 + 1;
          uVar6 = (ulong)uVar5;
          lint->nbpaths = uVar5;
        }
      }
      bVar3 = *path;
    } while (bVar3 != 0);
  }
  return;
}

Assistant:

static void
parsePath(xmllintState *lint, const xmlChar *path) {
    const xmlChar *cur;

    if (path == NULL)
	return;
    while (*path != 0) {
	if (lint->nbpaths >= MAX_PATHS) {
	    fprintf(lint->errStream, "MAX_PATHS reached: too many paths\n");
            lint->progresult = XMLLINT_ERR_UNCLASS;
	    return;
	}
	cur = path;
	while ((*cur == ' ') || (*cur == PATH_SEPARATOR))
	    cur++;
	path = cur;
	while ((*cur != 0) && (*cur != ' ') && (*cur != PATH_SEPARATOR))
	    cur++;
	if (cur != path) {
	    lint->paths[lint->nbpaths] = xmlStrndup(path, cur - path);
	    if (lint->paths[lint->nbpaths] != NULL)
		lint->nbpaths++;
	    path = cur;
	}
    }
}